

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_header.cpp
# Opt level: O3

void __thiscall pstore::header::header(header *this)

{
  long lVar1;
  uint uVar2;
  
  (this->a).header_size = 0x30;
  uuid::uuid(&(this->a).id);
  this->crc = 0;
  this->unused1 = 0;
  (this->footer_pos)._M_i.a_.a_ = 0;
  (this->a).signature1 = (_Type)0x72745370;
  (this->a).signature2 = 0x507ffff;
  *(undefined4 *)(this->a).version._M_elems = 0xd0001;
  lVar1 = 0;
  uVar2 = 0;
  do {
    uVar2 = uVar2 >> 8 ^
            *(uint *)(details::crc32_tab +
                     (ulong)(byte)((this->a).signature1._M_elems[lVar1] ^ (byte)uVar2) * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x20);
  this->crc = ~uVar2;
  return;
}

Assistant:

header::header ()
            : footer_pos () {

        PSTORE_STATIC_ASSERT (sizeof (file_signature1[0]) == sizeof (a.signature1[0]));
        PSTORE_STATIC_ASSERT (sizeof (file_signature1) == sizeof (a.signature1));
        PSTORE_ASSERT (footer_pos.is_lock_free ());

        a.signature1 = file_signature1;
        a.signature2 = file_signature2;
        a.version[0] = header::major_version;
        a.version[1] = header::minor_version;
        crc = this->get_crc ();
    }